

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdLevelVar(void *pMan,int iVar)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  cVar2 = *(char *)((long)pMan + (long)iVar * 8 + 0x28);
  if (cVar2 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar1 = *pMan;
    pcVar5 = (char *)((long)pMan + (long)iVar * 8 + 0x29);
    iVar3 = 0;
    do {
      iVar4 = (int)cVar2;
      if ((iVar4 < iVar1 + 0x61) || (*(int *)((long)pMan + 4) + 0x61 <= iVar4)) {
        iVar4 = *(int *)(*(long *)((long)pMan + 0x20) + -0x184 + (long)iVar4 * 4);
      }
      else {
        iVar4 = Dau_DsdLevelVar(pMan,iVar4 + -0x61);
        iVar4 = iVar4 + 1;
      }
      if (iVar3 <= iVar4) {
        iVar3 = iVar4;
      }
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  return iVar3;
}

Assistant:

int Dau_DsdLevelVar( void * pMan, int iVar )
{
    Dau_Dsd_t * p = (Dau_Dsd_t *)pMan;
    char * pStr;
    int LevelMax = 0, Level;
    for ( pStr = p->pVarDefs[iVar]; *pStr; pStr++ )
    {
        if ( *pStr >= 'a' + p->nVarsInit && *pStr < 'a' + p->nVarsUsed )
            Level = 1 + Dau_DsdLevelVar( p, *pStr - 'a' );
        else
            Level = p->pVarLevels[*pStr - 'a'];
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}